

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall CommandDrawString::SetStringToTag(CommandDrawString *this,AActor *actor)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *copyStr;
  
  if (actor == (AActor *)0x0) {
    this->cache = -1;
    FString::operator=(&this->str,(char *)"");
    return;
  }
  if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar1 = (actor->super_DThinker).super_DObject.Class;
  if ((PClass *)this->cache == pPVar1) {
    return;
  }
  if (pPVar1 == (PClass *)0x0) {
    iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
  }
  this->cache = (intptr_t)(actor->super_DThinker).super_DObject.Class;
  copyStr = AActor::GetTag(actor,(char *)0x0);
  FString::operator=(&this->str,copyStr);
  RealignString(this);
  return;
}

Assistant:

void SetStringToTag(AActor *actor)
		{
			if (actor != NULL)
			{
				if ((intptr_t)actor->GetClass() != cache)
				{
					cache = (intptr_t)actor->GetClass();
					str = actor->GetTag();
					RealignString();
				}
			}
			else
			{
				cache = -1;
				str = "";
			}
		}